

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeNext(BtCursor *pCur,int *pRes)

{
  long lVar1;
  BtCursor *pCur_00;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  BtCursor *in_RSI;
  long in_RDI;
  MemPage *pPage;
  int idx;
  int rc;
  BtCursor *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  u32 in_stack_ffffffffffffffe4;
  int local_4;
  
  if (*(char *)(in_RDI + 0x6d) != '\x01') {
    if (*(byte *)(in_RDI + 0x6d) < 3) {
      iVar3 = 0;
    }
    else {
      iVar3 = btreeRestoreCursorPosition(in_stack_ffffffffffffffc8);
    }
    if (iVar3 != 0) {
      return iVar3;
    }
    if (*(char *)(in_RDI + 0x6d) == '\0') {
      *(undefined4 *)&in_RSI->pBtree = 1;
      return 0;
    }
    if (*(int *)(in_RDI + 0x68) != 0) {
      *(undefined1 *)(in_RDI + 0x6d) = 1;
      if (0 < *(int *)(in_RDI + 0x68)) {
        *(undefined4 *)(in_RDI + 0x68) = 0;
        return 0;
      }
      *(undefined4 *)(in_RDI + 0x68) = 0;
    }
    in_stack_ffffffffffffffd4 = 0;
    in_stack_ffffffffffffffe4 = 0;
  }
  lVar1 = *(long *)(in_RDI + 0xa0 + (long)*(short *)(in_RDI + 0x70) * 8);
  uVar2 = *(short *)(in_RDI + 0x72 + (long)*(short *)(in_RDI + 0x70) * 2) + 1;
  *(ushort *)(in_RDI + 0x72 + (long)*(short *)(in_RDI + 0x70) * 2) = uVar2;
  uVar4 = (uint)uVar2;
  if (uVar4 < *(ushort *)(lVar1 + 0x12)) {
    if (*(char *)(lVar1 + 5) == '\0') {
      local_4 = moveToLeftmost((BtCursor *)CONCAT44(in_stack_ffffffffffffffe4,uVar4));
    }
    else {
      local_4 = 0;
    }
  }
  else if (*(char *)(lVar1 + 5) == '\0') {
    sqlite3Get4byte((u8 *)(*(long *)(lVar1 + 0x50) + (long)(int)(*(byte *)(lVar1 + 6) + 8)));
    local_4 = moveToChild(in_RSI,in_stack_ffffffffffffffe4);
    if (local_4 == 0) {
      local_4 = moveToLeftmost((BtCursor *)(ulong)uVar4);
    }
  }
  else {
    do {
      if (*(short *)(in_RDI + 0x70) == 0) {
        *(undefined4 *)&in_RSI->pBtree = 1;
        *(undefined1 *)(in_RDI + 0x6d) = 0;
        return 0;
      }
      moveToParent((BtCursor *)0x150ce8);
      pCur_00 = *(BtCursor **)(in_RDI + 0xa0 + (long)*(short *)(in_RDI + 0x70) * 8);
    } while (*(ushort *)((long)&pCur_00->pNext + 2) <=
             *(ushort *)(in_RDI + 0x72 + (long)*(short *)(in_RDI + 0x70) * 2));
    if (*(char *)((long)&pCur_00->pBtree + 2) == '\0') {
      local_4 = 0;
    }
    else {
      local_4 = sqlite3BtreeNext(pCur_00,(int *)CONCAT44(in_stack_ffffffffffffffd4,
                                                         in_stack_ffffffffffffffd0));
    }
  }
  return local_4;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur, int *pRes){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorHoldsMutex(pCur) );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  assert( *pRes==0 );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      *pRes = 1;
      return SQLITE_OK;
    }
    if( pCur->skipNext ){
      assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_SKIPNEXT );
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ){
        pCur->skipNext = 0;
        return SQLITE_OK;
      }
      pCur->skipNext = 0;
    }
  }

  pPage = pCur->apPage[pCur->iPage];
  idx = ++pCur->aiIdx[pCur->iPage];
  assert( pPage->isInit );

  /* If the database file is corrupt, it is possible for the value of idx 
  ** to be invalid here. This can only occur if a second cursor modifies
  ** the page while cursor pCur is holding a reference to it. Which can
  ** only happen if the database is corrupt in such a way as to link the
  ** page into more than one b-tree structure. */
  testcase( idx>pPage->nCell );

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        *pRes = 1;
        pCur->eState = CURSOR_INVALID;
        return SQLITE_OK;
      }
      moveToParent(pCur);
      pPage = pCur->apPage[pCur->iPage];
    }while( pCur->aiIdx[pCur->iPage]>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, pRes);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}